

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

Expression * __thiscall wasm::TranslateToFuzzReader::makeLoop(TranslateToFuzzReader *this,Type type)

{
  pointer *pppEVar1;
  FunctionCreationContext *pFVar2;
  bool bVar3;
  Loop *pLVar4;
  Expression *pEVar5;
  Block *pBVar6;
  string_view sVar7;
  optional<wasm::Type> type_00;
  Break *local_50;
  undefined1 auStack_48 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> list;
  
  pLVar4 = MixedArena::alloc<wasm::Loop>(&this->wasm->allocator);
  (pLVar4->super_SpecificExpression<(wasm::Expression::Id)3>).super_Expression.type.id = type.id;
  sVar7 = (string_view)makeLabel(this);
  (pLVar4->name).super_IString.str = sVar7;
  auStack_48 = (undefined1  [8])pLVar4;
  std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::emplace_back<wasm::Expression*>
            ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)
             &this->funcContext->breakableStack,(Expression **)auStack_48);
  auStack_48 = (undefined1  [8])pLVar4;
  std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::emplace_back<wasm::Expression*>
            ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)
             &this->funcContext->hangStack,(Expression **)auStack_48);
  bVar3 = Random::oneIn(&this->random,2);
  if (bVar3) {
    pEVar5 = makeMaybeBlock(this,type);
    pLVar4->body = pEVar5;
  }
  else {
    auStack_48 = (undefined1  [8])0x0;
    list.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    list.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_50 = (Break *)makeMaybeBlock(this,(Type)0x0);
    std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
    emplace_back<wasm::Expression*>
              ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_48,
               (Expression **)&local_50);
    sVar7 = (pLVar4->name).super_IString.str;
    pEVar5 = makeCondition(this);
    local_50 = Builder::makeBreak(&this->builder,(Name)sVar7,(Expression *)0x0,pEVar5);
    std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
    emplace_back<wasm::Expression*>
              ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_48,
               (Expression **)&local_50);
    local_50 = (Break *)make(this,type);
    std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
    emplace_back<wasm::Expression*>
              ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_48,
               (Expression **)&local_50);
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = 1;
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload._M_value.id = (Type)(Type)type.id;
    pBVar6 = Builder::
             makeBlock<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_true>
                       (&this->builder,
                        (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                        auStack_48,type_00);
    pLVar4->body = (Expression *)pBVar6;
    std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
              ((_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)auStack_48);
  }
  pFVar2 = this->funcContext;
  pppEVar1 = &(pFVar2->breakableStack).
              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  *pppEVar1 = *pppEVar1 + -1;
  pppEVar1 = &(pFVar2->hangStack).
              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  *pppEVar1 = *pppEVar1 + -1;
  wasm::Loop::finalize(pLVar4,type.id,1);
  return (Expression *)pLVar4;
}

Assistant:

Expression* TranslateToFuzzReader::makeLoop(Type type) {
  auto* ret = wasm.allocator.alloc<Loop>();
  ret->type = type; // So we have it during child creation
  ret->name = makeLabel();
  funcContext->breakableStack.push_back(ret);
  funcContext->hangStack.push_back(ret);
  // Either create random content, or do something more targeted
  if (oneIn(2)) {
    ret->body = makeMaybeBlock(type);
  } else {
    // Ensure a branch back. Also optionally create some loop vars.
    std::vector<Expression*> list;
    list.push_back(makeMaybeBlock(Type::none)); // Primary contents
    // Possible branch back
    list.push_back(builder.makeBreak(ret->name, nullptr, makeCondition()));
    list.push_back(make(type)); // Final element, so we have the right type
    ret->body = builder.makeBlock(list, type);
  }
  funcContext->breakableStack.pop_back();
  funcContext->hangStack.pop_back();
  ret->finalize(type);
  return ret;
}